

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_maketables.c
# Opt level: O2

uint8_t * coda_pcre2_maketables_8(pcre2_general_context_8 *gcontext)

{
  ushort uVar1;
  uint8_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  ushort **ppuVar5;
  byte bVar6;
  byte bVar7;
  uint8_t *puVar8;
  ulong uVar9;
  long lVar10;
  
  if (gcontext == (pcre2_general_context_8 *)0x0) {
    puVar4 = (uint8_t *)malloc(0x440);
  }
  else {
    puVar4 = (uint8_t *)(*(gcontext->memctl).malloc)(0x440,(gcontext->memctl).memory_data);
  }
  if (puVar4 != (uint8_t *)0x0) {
    puVar8 = puVar4;
    for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
      iVar3 = tolower((int)lVar10);
      *puVar8 = (uint8_t)iVar3;
      puVar8 = puVar8 + 1;
    }
    ppuVar5 = __ctype_b_loc();
    for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
      if ((*(byte *)((long)*ppuVar5 + lVar10 * 2 + 1) & 2) == 0) {
        iVar3 = tolower((int)lVar10);
      }
      else {
        iVar3 = toupper((int)lVar10);
      }
      uVar2 = (uint8_t)iVar3;
      if (0xff < iVar3) {
        uVar2 = (uint8_t)lVar10;
      }
      puVar8[lVar10] = uVar2;
    }
    memset(puVar8 + 0x100,0,0x140);
    for (uVar9 = 0; uVar9 != 0x100; uVar9 = uVar9 + 1) {
      uVar1 = (*ppuVar5)[uVar9];
      bVar7 = (byte)uVar9;
      if ((uVar1 >> 0xb & 1) != 0) {
        puVar8[(uVar9 >> 3 & 0x1fffffff | 0x40) + 0x100] =
             puVar8[(uVar9 >> 3 & 0x1fffffff | 0x40) + 0x100] | '\x01' << (bVar7 & 7);
        uVar1 = (*ppuVar5)[uVar9];
      }
      if ((uVar1 >> 8 & 1) != 0) {
        puVar8[(uVar9 >> 3 & 0x1fffffff | 0x60) + 0x100] =
             puVar8[(uVar9 >> 3 & 0x1fffffff | 0x60) + 0x100] | '\x01' << (bVar7 & 7);
        uVar1 = (*ppuVar5)[uVar9];
      }
      if ((uVar1 >> 9 & 1) != 0) {
        puVar8[(uVar9 >> 3 & 0x1fffffff | 0x80) + 0x100] =
             puVar8[(uVar9 >> 3 & 0x1fffffff | 0x80) + 0x100] | '\x01' << (bVar7 & 7);
        uVar1 = (*ppuVar5)[uVar9];
      }
      if ((uVar1 & 8) != 0) {
        puVar8[(uVar9 >> 3 & 0x1fffffff | 0xa0) + 0x100] =
             puVar8[(uVar9 >> 3 & 0x1fffffff | 0xa0) + 0x100] | '\x01' << (bVar7 & 7);
      }
      if (uVar9 == 0x5f) {
        puVar8[0x1ab] = puVar8[0x1ab] | 0x80;
      }
      uVar1 = (*ppuVar5)[uVar9];
      if ((uVar1 >> 0xd & 1) != 0) {
        puVar8[(uVar9 >> 3) + 0x100] = puVar8[(uVar9 >> 3) + 0x100] | '\x01' << (bVar7 & 7);
        uVar1 = (*ppuVar5)[uVar9];
      }
      if ((uVar1 >> 0xc & 1) != 0) {
        puVar8[(uVar9 >> 3 & 0x1fffffff | 0x20) + 0x100] =
             puVar8[(uVar9 >> 3 & 0x1fffffff | 0x20) + 0x100] | '\x01' << (bVar7 & 7);
        uVar1 = (*ppuVar5)[uVar9];
      }
      if ((short)uVar1 < 0) {
        puVar8[(uVar9 >> 3 & 0x1fffffff | 0xc0) + 0x100] =
             puVar8[(uVar9 >> 3 & 0x1fffffff | 0xc0) + 0x100] | '\x01' << (bVar7 & 7);
        uVar1 = (*ppuVar5)[uVar9];
      }
      if ((uVar1 >> 0xe & 1) != 0) {
        puVar8[(uVar9 >> 3 & 0x1fffffff | 0xe0) + 0x100] =
             puVar8[(uVar9 >> 3 & 0x1fffffff | 0xe0) + 0x100] | '\x01' << (bVar7 & 7);
        uVar1 = (*ppuVar5)[uVar9];
      }
      if ((uVar1 & 4) != 0) {
        puVar8[(uVar9 >> 3 & 0x1fffffff | 0x100) + 0x100] =
             puVar8[(uVar9 >> 3 & 0x1fffffff | 0x100) + 0x100] | '\x01' << (bVar7 & 7);
        uVar1 = (*ppuVar5)[uVar9];
      }
      if ((uVar1 & 2) != 0) {
        puVar8[(uVar9 >> 3 & 0x1fffffff | 0x120) + 0x100] =
             puVar8[(uVar9 >> 3 & 0x1fffffff | 0x120) + 0x100] | '\x01' << (bVar7 & 7);
      }
    }
    for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
      uVar1 = (*ppuVar5)[lVar10];
      bVar7 = (byte)(uVar1 >> 8);
      bVar7 = bVar7 & 8 | (byte)(uVar1 >> 7) & 4 | bVar7 >> 1 & 2 | bVar7 >> 5 & 1;
      bVar6 = bVar7 + 0x10;
      if ((uVar1 & 8) != 0) {
        bVar7 = bVar6;
      }
      if (lVar10 == 0x5f) {
        bVar7 = bVar6;
      }
      puVar8[lVar10 + 0x240] = bVar7;
    }
  }
  return puVar4;
}

Assistant:

PCRE2_EXP_DEFN const uint8_t * PCRE2_CALL_CONVENTION
pcre2_maketables(pcre2_general_context *gcontext)
{
uint8_t *yield = (uint8_t *)((gcontext != NULL)?
  gcontext->memctl.malloc(TABLES_LENGTH, gcontext->memctl.memory_data) :
  malloc(TABLES_LENGTH));
#endif  /* PCRE2_DFTABLES */

int i;
uint8_t *p;

if (yield == NULL) return NULL;
p = yield;

/* First comes the lower casing table */

for (i = 0; i < 256; i++) *p++ = tolower(i);

/* Next the case-flipping table */

for (i = 0; i < 256; i++)
  {
  int c = islower(i)? toupper(i) : tolower(i);
  *p++ = (c < 256)? c : i;
  }

/* Then the character class tables. Don't try to be clever and save effort on
exclusive ones - in some locales things may be different.

Note that the table for "space" includes everything "isspace" gives, including
VT in the default locale. This makes it work for the POSIX class [:space:].
From PCRE1 release 8.34 and for all PCRE2 releases it is also correct for Perl
space, because Perl added VT at release 5.18.

Note also that it is possible for a character to be alnum or alpha without
being lower or upper, such as "male and female ordinals" (\xAA and \xBA) in the
fr_FR locale (at least under Debian Linux's locales as of 12/2005). So we must
test for alnum specially. */

memset(p, 0, cbit_length);
for (i = 0; i < 256; i++)
  {
  if (isdigit(i))  p[cbit_digit  + i/8] |= 1u << (i&7);
  if (isupper(i))  p[cbit_upper  + i/8] |= 1u << (i&7);
  if (islower(i))  p[cbit_lower  + i/8] |= 1u << (i&7);
  if (isalnum(i))  p[cbit_word   + i/8] |= 1u << (i&7);
  if (i == '_')    p[cbit_word   + i/8] |= 1u << (i&7);
  if (isspace(i))  p[cbit_space  + i/8] |= 1u << (i&7);
  if (isxdigit(i)) p[cbit_xdigit + i/8] |= 1u << (i&7);
  if (isgraph(i))  p[cbit_graph  + i/8] |= 1u << (i&7);
  if (isprint(i))  p[cbit_print  + i/8] |= 1u << (i&7);
  if (ispunct(i))  p[cbit_punct  + i/8] |= 1u << (i&7);
  if (iscntrl(i))  p[cbit_cntrl  + i/8] |= 1u << (i&7);
  }
p += cbit_length;

/* Finally, the character type table. In this, we used to exclude VT from the
white space chars, because Perl didn't recognize it as such for \s and for
comments within regexes. However, Perl changed at release 5.18, so PCRE1
changed at release 8.34 and it's always been this way for PCRE2. */

for (i = 0; i < 256; i++)
  {
  int x = 0;
  if (isspace(i)) x += ctype_space;
  if (isalpha(i)) x += ctype_letter;
  if (islower(i)) x += ctype_lcletter;
  if (isdigit(i)) x += ctype_digit;
  if (isalnum(i) || i == '_') x += ctype_word;
  *p++ = x;
  }

return yield;
}